

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thrd_sleep.c
# Opt level: O0

int thrd_sleep(timespec *duration,timespec *remaining)

{
  int iVar1;
  int *piVar2;
  timespec *remaining_local;
  timespec *duration_local;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  iVar1 = nanosleep((timespec *)duration,(timespec *)remaining);
  if (iVar1 == 0) {
    duration_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 4) {
      duration_local._4_4_ = -1;
    }
    else {
      duration_local._4_4_ = -2;
    }
  }
  return duration_local._4_4_;
}

Assistant:

int thrd_sleep( const struct timespec * duration, struct timespec * remaining )
{
    errno = 0;

    if ( nanosleep( duration, remaining ) == 0 )
    {
        return 0;
    }

    if ( errno == EINTR )
    {
        return -1;
    }

    return -2;
}